

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_parser.c
# Opt level: O0

char * flatcc_json_parser_char_array(flatcc_json_parser_t *ctx,char *buf,char *end,char *s,size_t n)

{
  char *pcVar1;
  size_t local_50;
  size_t k;
  char *mark;
  size_t sStack_38;
  flatcc_json_parser_escape_buffer_t code;
  size_t n_local;
  char *s_local;
  char *end_local;
  char *buf_local;
  flatcc_json_parser_t *ctx_local;
  
  sStack_38 = n;
  end_local = flatcc_json_parser_string_start(ctx,buf,end);
  n_local = (size_t)s;
  if (end_local != end) {
    while (*end_local != '\"') {
      pcVar1 = flatcc_json_parser_string_part(ctx,end_local,end);
      if (pcVar1 == end) {
        return end;
      }
      local_50 = (long)pcVar1 - (long)end_local;
      if (sStack_38 < local_50) {
        if ((ctx->flags & 8) == 0) {
          pcVar1 = flatcc_json_parser_set_error(ctx,pcVar1,end,0x22);
          return pcVar1;
        }
        local_50 = sStack_38;
      }
      memcpy((void *)n_local,end_local,local_50);
      n_local = local_50 + n_local;
      sStack_38 = sStack_38 - local_50;
      end_local = pcVar1;
      if (*pcVar1 == '\"') break;
      end_local = flatcc_json_parser_string_escape(ctx,pcVar1,end,(char *)((long)&mark + 3));
      if (end_local == end) {
        return end;
      }
      local_50 = (size_t)mark._3_1_;
      if (sStack_38 < local_50) {
        if ((ctx->flags & 8) == 0) {
          pcVar1 = flatcc_json_parser_set_error(ctx,end_local,end,0x22);
          return pcVar1;
        }
        local_50 = sStack_38;
      }
      memcpy((void *)n_local,(void *)((long)&mark + 4),local_50);
      n_local = local_50 + n_local;
      sStack_38 = sStack_38 - local_50;
    }
  }
  if (sStack_38 != 0) {
    if ((ctx->flags & 0x10) != 0) {
      pcVar1 = flatcc_json_parser_set_error(ctx,end_local,end,0x21);
      return pcVar1;
    }
    memset((void *)n_local,0,sStack_38);
  }
  pcVar1 = flatcc_json_parser_string_end(ctx,end_local,end);
  return pcVar1;
}

Assistant:

const char *flatcc_json_parser_char_array(flatcc_json_parser_t *ctx,
        const char *buf, const char *end, char *s, size_t n)
{
    flatcc_json_parser_escape_buffer_t code;
    const char *mark;
    size_t k = 0;

    buf = flatcc_json_parser_string_start(ctx, buf, end);
    if (buf != end)
    while (*buf != '\"') {
        buf = flatcc_json_parser_string_part(ctx, (mark = buf), end);
        if (buf == end) return end;
        k = (size_t)(buf - mark);
        if (k > n) {
            if (!(ctx->flags & flatcc_json_parser_f_skip_array_overflow)) {
                return flatcc_json_parser_set_error(ctx, buf, end, flatcc_json_parser_error_array_overflow);
            }
            k = n; /* Might truncate UTF-8. */
        }
        memcpy(s, mark, k);
        s += k;
        n -= k;
        if (*buf == '\"') break;
        buf = flatcc_json_parser_string_escape(ctx, buf, end, code);
        if (buf == end) return end;
        k = (size_t)code[0];
        mark = code + 1;
        if (k > n) {
            if (!(ctx->flags & flatcc_json_parser_f_skip_array_overflow)) {
                return flatcc_json_parser_set_error(ctx, buf, end, flatcc_json_parser_error_array_overflow);
            }
            k = n; /* Might truncate UTF-8. */
        }
        memcpy(s, mark, k);
        s += k;
        n -= k;
    }
    if (n != 0) {
        if (ctx->flags & flatcc_json_parser_f_reject_array_underflow) {
            return flatcc_json_parser_set_error(ctx, buf, end, flatcc_json_parser_error_array_underflow);
        }
        memset(s, 0, n);
    }
    return flatcc_json_parser_string_end(ctx, buf, end);
}